

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

Graph * Omega_h::invert_map_by_sorting(Graph *__return_storage_ptr__,LOs *a2b,LO nb)

{
  Write<int> local_c0;
  Write<int> local_b0;
  Write<int> local_a0;
  Write<int> local_90;
  LOs b2ba;
  Write<int> local_70;
  Write<int> local_60;
  Write<int> ba2b;
  LOs ba2ab;
  Write<int> local_30;
  
  Write<int>::Write(&local_30,&a2b->write_);
  sort_by_keys<int>((Omega_h *)&ba2ab,(Read<int> *)&local_30,1);
  Write<int>::~Write(&local_30);
  Write<int>::Write(&local_60,&ba2ab.write_);
  Write<int>::Write(&local_70,&a2b->write_);
  unmap<int>((Omega_h *)&ba2b,(LOs *)&local_60,(Read<int> *)&local_70,1);
  Write<int>::~Write(&local_70);
  Write<int>::~Write(&local_60);
  Write<int>::Write(&local_a0,&ba2b);
  Read<int>::Read((Read<signed_char> *)&local_90,&local_a0);
  invert_funnel((Omega_h *)&b2ba,(LOs *)&local_90,nb);
  Write<int>::~Write(&local_90);
  Write<int>::~Write(&local_a0);
  Write<int>::Write(&local_b0,&b2ba.write_);
  Write<int>::Write(&local_c0,&ba2ab.write_);
  Graph::Graph(__return_storage_ptr__,(LOs *)&local_b0,(LOs *)&local_c0);
  Write<int>::~Write(&local_c0);
  Write<int>::~Write(&local_b0);
  Write<int>::~Write(&b2ba.write_);
  Write<int>::~Write(&ba2b);
  Write<int>::~Write(&ba2ab.write_);
  return __return_storage_ptr__;
}

Assistant:

Graph invert_map_by_sorting(LOs a2b, LO nb) {
  auto& ab2b = a2b;
  auto ba2ab = sort_by_keys(ab2b);
  auto ba2b = unmap(ba2ab, ab2b, 1);
  auto b2ba = invert_funnel(ba2b, nb);
  auto& ba2a = ba2ab;
  return Graph(b2ba, ba2a);
}